

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

bool QtPrivate::intersect_path
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  QGraphicsItemPrivate *pQVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  long lVar5;
  qreal *pqVar6;
  QTransform *pQVar7;
  QPainterPath *path;
  long in_FS_OFFSET;
  byte bVar8;
  double dVar9;
  QPainterPath itemPath;
  QPainterPath scenePath;
  QPainterPath itemPath_1;
  QTransform transform;
  undefined1 local_160 [16];
  undefined8 uStack_150;
  undefined1 local_148 [12];
  undefined4 uStack_13c;
  undefined1 local_130 [8];
  undefined1 *local_128 [10];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)local_130,(QPainterPath *)intersectData);
  local_148._8_4_ = 0xffffffff;
  local_148._0_8_ = 0xffffffffffffffff;
  uStack_13c = 0xffffffff;
  uStack_150._0_4_ = 0xffffffff;
  local_160._8_8_ = 0xffffffffffffffff;
  uStack_150._4_4_ = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(local_160 + 8,item);
  dVar9 = stack0xfffffffffffffec0;
  dVar2 = (double)local_148._0_8_;
  if (((double)local_148._0_8_ == 0.0) && (!NAN((double)local_148._0_8_))) {
    uStack_150 = uStack_150 + 0.0;
    local_160._8_8_ = (double)local_160._8_8_ + -1e-05;
    dVar2 = (double)local_148._0_8_ + 2e-05;
    dVar9 = stack0xfffffffffffffec0 + 0.0;
    local_148._8_4_ = SUB84(dVar9,0);
    local_148._0_8_ = dVar2;
    uStack_13c = (int)((ulong)dVar9 >> 0x20);
  }
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    dVar3 = uStack_150 + -1e-05;
    uStack_150._0_4_ = SUB84(dVar3,0);
    local_160._8_8_ = (double)local_160._8_8_ + 0.0;
    uStack_150._4_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar9 = dVar9 + 2e-05;
    stack0xfffffffffffffec0 = dVar9;
    local_148._0_8_ = dVar2;
  }
  pQVar1 = (item->d_ptr).d;
  if ((*(ulong *)&pQVar1->field_0x160 & 0x2000040000) == 0) {
    local_d8.m_matrix[0][2] = -NAN;
    local_d8.m_matrix[1][0] = -NAN;
    local_d8.m_matrix[0][1]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][0] = -NAN;
    local_d8.m_matrix[0][1]._4_4_ = 0xffffffff;
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_d8);
    }
    else {
      dVar3 = (pQVar1->sceneTransform).m_matrix[2][1] + uStack_150;
      local_d8.m_matrix[0][1]._0_4_ = SUB84(dVar3,0);
      local_d8.m_matrix[0][0] = (pQVar1->sceneTransform).m_matrix[2][0] + (double)local_160._8_8_;
      local_d8.m_matrix[0][1]._4_4_ = (int)((ulong)dVar3 >> 0x20);
      local_d8.m_matrix[0][2] = dVar2;
      local_d8.m_matrix[1][0] = dVar9;
    }
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar4 = QPainterPath::contains((QRectF *)local_130);
    }
    else {
      cVar4 = QPainterPath::intersects((QRectF *)local_130);
    }
    if (cVar4 != '\x01' || IntersectsItemShape < mode) goto LAB_0062955a;
    local_128[0] = &DAT_aaaaaaaaaaaaaaaa;
    if ((*(ulong *)&pQVar1->field_0x160 & 0x4000000000000000) == 0) {
      QTransform::inverted((bool *)&local_88);
      QTransform::map((QPainterPath *)local_128);
    }
    else {
      QPainterPath::translated
                (-(pQVar1->sceneTransform).m_matrix[2][0],-(pQVar1->sceneTransform).m_matrix[2][1]);
    }
    path = (QPainterPath *)local_128;
    cVar4 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,path,mode);
  }
  else {
    pqVar6 = (qreal *)&DAT_006f4bb8;
    pQVar7 = &local_88;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar7->m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar8 * -2 + 1;
      pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&local_88,item,deviceTransform);
    local_160._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTransform::inverted((bool *)local_128);
    QTransform::operator*(&local_d8,deviceTransform);
    QTransform::map((QPainterPath *)local_160);
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar4 = QPainterPath::contains((QRectF *)local_160);
    }
    else {
      cVar4 = QPainterPath::intersects((QRectF *)local_160);
    }
    if (cVar4 == '\x01' && mode < ContainsItemBoundingRect) {
      cVar4 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,(QPainterPath *)local_160,mode);
    }
    path = (QPainterPath *)local_160;
  }
  QPainterPath::~QPainterPath(path);
LAB_0062955a:
  QPainterPath::~QPainterPath((QPainterPath *)local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

static bool intersect_path(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QPainterPath scenePath = *static_cast<const QPainterPath *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QPainterPath itemPath = (deviceTransform * transform.inverted()).map(scenePath);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemPath.contains(brect);
            else
                keep = itemPath.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape))
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = scenePath.contains(itemSceneBoundingRect);
            else
                keep = scenePath.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath = itemd->sceneTransformTranslateOnly
                                      ? scenePath.translated(-itemd->sceneTransform.dx(),
                                                             -itemd->sceneTransform.dy())
                                      : itemd->sceneTransform.inverted().map(scenePath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        }
        return keep;
    }